

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STL_set.cpp
# Opt level: O0

void FindPeople(void)

{
  istream *piVar1;
  size_type sVar2;
  ostream *poVar3;
  pair<std::_Rb_tree_const_iterator<people>,_bool> pVar4;
  people local_90;
  int local_84;
  _Rb_tree_const_iterator<people> _Stack_80;
  int j;
  undefined1 local_78;
  people local_70 [2];
  int local_54;
  undefined1 local_50 [4];
  int i;
  set<people,_std::less<people>,_std::allocator<people>_> s;
  int local_18;
  int age;
  int w;
  int h;
  int m;
  int n;
  
  piVar1 = (istream *)std::istream::operator>>((istream *)&std::cin,&h);
  std::istream::operator>>(piVar1,&w);
  std::set<people,_std::less<people>,_std::allocator<people>_>::set
            ((set<people,_std::less<people>,_std::allocator<people>_> *)local_50);
  for (local_54 = 0; local_54 < h; local_54 = local_54 + 1) {
    piVar1 = (istream *)std::istream::operator>>((istream *)&std::cin,&age);
    piVar1 = (istream *)std::istream::operator>>(piVar1,&local_18);
    std::istream::operator>>
              (piVar1,(int *)((long)&s._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
    FindPeople::people::people
              (local_70,age,local_18,s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
    pVar4 = std::set<people,_std::less<people>,_std::allocator<people>_>::insert
                      ((set<people,_std::less<people>,_std::allocator<people>_> *)local_50,local_70)
    ;
    _Stack_80 = pVar4.first._M_node;
    local_78 = pVar4.second;
  }
  for (local_84 = 0; local_84 < w; local_84 = local_84 + 1) {
    piVar1 = (istream *)std::istream::operator>>((istream *)&std::cin,&age);
    piVar1 = (istream *)std::istream::operator>>(piVar1,&local_18);
    std::istream::operator>>
              (piVar1,(int *)((long)&s._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
    FindPeople::people::people
              (&local_90,age,local_18,s._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
    sVar2 = std::set<people,_std::less<people>,_std::allocator<people>_>::count
                      ((set<people,_std::less<people>,_std::allocator<people>_> *)local_50,&local_90
                      );
    if (sVar2 == 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"NO");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"YES");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
  }
  std::set<people,_std::less<people>,_std::allocator<people>_>::~set
            ((set<people,_std::less<people>,_std::allocator<people>_> *)local_50);
  return;
}

Assistant:

void FindPeople() {
    struct people{
        int h;
        int w;
        int age;
        //自定义构造函数，来代替people.h 等的输入，直接调用people(h,w,age)传入h,w,age
        people(int _h,int _w, int _age)
        {
            h = _h;
            w = _w;
            age = _age;
        }
        //重载 "<"
        bool operator <(const people &rhs) const
        {
            if (h != rhs.h)
                return h < rhs.h;
            if (w != rhs.w)
                return w < rhs.w;
            return age < rhs.age;
        }
    };
    int n,m,h,w,age;
    cin >> n >> m;
    set<people> s;
    for (int i = 0; i < n; ++i) {
        cin >> h >> w >> age;
        s.insert(people(h,w,age));
    }
    for (int j = 0; j < m; ++j) {
        cin >> h >> w >> age;
        if(s.count(people(h,w,age)))
            cout << "YES" << endl;
        else
            cout << "NO" << endl;
    }
}